

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O3

Image * vera::toLuma(Image *__return_storage_ptr__,Image *_image)

{
  uint _width;
  uint _height;
  int iVar1;
  undefined4 extraout_var;
  ulong uVar2;
  ulong uVar3;
  float extraout_XMM0_Da;
  float extraout_XMM0_Db;
  float in_XMM1_Da;
  
  _width = (*_image->_vptr_Image[6])(_image);
  _height = (*_image->_vptr_Image[7])(_image);
  Image::Image(__return_storage_ptr__,_width,_height,1);
  if (0 < (int)_height) {
    uVar3 = 0;
    do {
      if (0 < (int)_width) {
        uVar2 = 0;
        do {
          iVar1 = (*_image->_vptr_Image[0xe])(_image,uVar2,uVar3);
          (*_image->_vptr_Image[0x19])(_image,CONCAT44(extraout_var,iVar1));
          in_XMM1_Da = in_XMM1_Da * 0.0722;
          Image::setValue(__return_storage_ptr__,
                          (long)__return_storage_ptr__->m_channels *
                          ((long)__return_storage_ptr__->m_width * uVar3 + uVar2),
                          extraout_XMM0_Db * 0.7152 + extraout_XMM0_Da * 0.2126 + in_XMM1_Da);
          uVar2 = uVar2 + 1;
        } while (_width != uVar2);
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 != _height);
  }
  return __return_storage_ptr__;
}

Assistant:

Image toLuma(const Image& _image) {
    int width = _image.getWidth();
    int height = _image.getHeight();

    Image out = Image(width, height, 1);
    for (int y = 0; y < height; y++) {
        for (int x = 0; x < width; x++) {
            glm::vec4 c = _image.getColor( _image.getIndex(x, y) );
            float value = glm::dot(glm::vec3(c.x, c.y, c.z), glm::vec3(0.2126f, 0.7152f, 0.0722f));
            out.setValue( out.getIndex(x, y), value);
        }
    }

    return out;
}